

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::StringAtoIMethod::StringAtoIMethod
          (StringAtoIMethod *this,Builtins *builtins,KnownSystemName knownNameId,int base)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined2 uVar1;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *in_RDI;
  Type *returnType;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
  *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  undefined8 uVar2;
  SimpleSystemSubroutine *this_00;
  
  uVar1 = (undefined2)((uint)in_EDX >> 0x10);
  uVar2._0_4_ = Unknown;
  uVar2._4_4_ = 0;
  this_00 = (SimpleSystemSubroutine *)0x0;
  returnType = (Type *)&stack0xffffffffffffffc8;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             0x13913d8);
  SimpleSystemSubroutine::SimpleSystemSubroutine
            (this_00,SUB84(uVar2,4),(SubroutineKind)uVar2,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8,returnType,SUB21((ushort)uVar1 >> 8,0),SUB21(uVar1,0));
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector(in_RDI);
  (in_RDI->super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__StringAtoIMethod_01a2dc30;
  *(undefined4 *)
   ((long)&in_RDI[4].
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = in_ECX;
  return;
}

Assistant:

StringAtoIMethod(const Builtins& builtins, KnownSystemName knownNameId, int base) :
        SimpleSystemSubroutine(knownNameId, SubroutineKind::Function, 0, {}, builtins.integerType,
                               true),
        base(base) {}